

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

int create_framebuffers(Init *init,RenderData *data)

{
  pointer ppVVar1;
  ulong uVar2;
  VkResult VVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  anon_union_24_2_293c120a_for_Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>_1
  local_88;
  VkRenderPass pVStack_70;
  undefined8 local_68;
  VkImageView *ppVStack_60;
  VkExtent2D local_58;
  undefined8 uStack_50;
  VkImageView attachments [1];
  
  vkb::Swapchain::get_images
            ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_88.m_value,
             &init->swapchain);
  vkb::Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::value
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)attachments,
             (Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_88.m_value);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::_M_move_assign
            (&data->swapchain_images,
             (_Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)attachments);
  std::_Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~_Vector_base
            ((_Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)attachments);
  vkb::Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::destroy
            ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_88.m_value);
  vkb::Swapchain::get_image_views
            ((Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)
             &local_88.m_value,&init->swapchain);
  vkb::Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>::value
            ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)attachments,
             (Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)
             &local_88.m_value);
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::_M_move_assign
            (&data->swapchain_image_views,
             (_Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)attachments);
  std::_Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::~_Vector_base
            ((_Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)attachments);
  vkb::Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>::destroy
            ((Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)
             &local_88.m_value);
  std::vector<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>::resize
            (&data->framebuffers,
             (long)(data->swapchain_image_views).
                   super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(data->swapchain_image_views).
                   super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  lVar5 = 0;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    ppVVar1 = (data->swapchain_image_views).
              super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar6 = (long)(data->swapchain_image_views).
                  super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3;
    if (uVar6 <= uVar4) break;
    attachments[0] = *(VkImageView *)((long)ppVVar1 + lVar5);
    local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.m_value.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x25;
    pVStack_70 = data->render_pass;
    local_68 = 1;
    ppVStack_60 = attachments;
    local_58 = (init->swapchain).extent;
    uStack_50 = 1;
    VVar3 = vkb::DispatchTable::createFramebuffer
                      (&init->disp,(VkFramebufferCreateInfo *)&local_88.m_value,
                       (VkAllocationCallbacks *)0x0,
                       (VkFramebuffer *)
                       ((long)(data->framebuffers).
                              super__Vector_base<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 8;
    uVar2 = uVar4 + 1;
  } while (VVar3 == VK_SUCCESS);
  return -(uint)(uVar4 < uVar6);
}

Assistant:

int create_framebuffers(Init& init, RenderData& data) {
    data.swapchain_images = init.swapchain.get_images().value();
    data.swapchain_image_views = init.swapchain.get_image_views().value();

    data.framebuffers.resize(data.swapchain_image_views.size());

    for (size_t i = 0; i < data.swapchain_image_views.size(); i++) {
        VkImageView attachments[] = { data.swapchain_image_views[i] };

        VkFramebufferCreateInfo framebuffer_info = {};
        framebuffer_info.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        framebuffer_info.renderPass = data.render_pass;
        framebuffer_info.attachmentCount = 1;
        framebuffer_info.pAttachments = attachments;
        framebuffer_info.width = init.swapchain.extent.width;
        framebuffer_info.height = init.swapchain.extent.height;
        framebuffer_info.layers = 1;

        if (init.disp.createFramebuffer(&framebuffer_info, nullptr, &data.framebuffers[i]) != VK_SUCCESS) {
            return -1; // failed to create framebuffer
        }
    }
    return 0;
}